

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

void __thiscall H264StreamReader::onShiftBuffer(H264StreamReader *this,int offset)

{
  int offset_local;
  H264StreamReader *this_local;
  
  MPEGStreamReader::onShiftBuffer(&this->super_MPEGStreamReader,offset);
  if (((this->super_MPEGStreamReader).m_lastDecodedPos == (uint8_t *)0x0) ||
     (this->m_priorityNalAddr < (this->super_MPEGStreamReader).m_lastDecodedPos)) {
    this->m_priorityNalAddr = (uint8_t *)0x0;
  }
  else {
    this->m_priorityNalAddr = this->m_priorityNalAddr + -(long)offset;
  }
  if ((this->super_MPEGStreamReader).m_lastDecodedPos < this->m_OffsetMetadataPtsAddr) {
    this->m_OffsetMetadataPtsAddr = this->m_OffsetMetadataPtsAddr + -(long)offset;
  }
  else {
    this->m_OffsetMetadataPtsAddr = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void H264StreamReader::onShiftBuffer(const int offset)
{
    MPEGStreamReader::onShiftBuffer(offset);
    if (m_lastDecodedPos && m_priorityNalAddr >= m_lastDecodedPos)
        m_priorityNalAddr -= offset;
    else
        m_priorityNalAddr = nullptr;
    if (m_OffsetMetadataPtsAddr > m_lastDecodedPos)
        m_OffsetMetadataPtsAddr -= offset;
    else
        m_OffsetMetadataPtsAddr = nullptr;
}